

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void __thiscall
CLIntercept::logBuild
          (CLIntercept *this,time_point buildTimeStart,cl_program program,cl_uint numDevices,
          cl_device_id *deviceList)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  cl_int cVar4;
  cl_int cVar5;
  long lVar6;
  mapped_type *pmVar7;
  char *pcVar8;
  ulong uVar9;
  bool bVar10;
  float __x;
  double dVar11;
  cl_uint numDevices_local;
  cl_program program_local;
  cl_build_status buildStatus;
  char *local_1a8;
  char *local_1a0;
  cl_device_id *local_198;
  pthread_mutex_t *local_190;
  cl_device_id *localDeviceList;
  size_t buildLogSize;
  CEnumNameMap *local_160;
  string local_158;
  char numberString [256];
  
  numDevices_local = numDevices;
  program_local = program;
  lVar6 = std::chrono::_V2::steady_clock::now();
  local_190 = (pthread_mutex_t *)&this->m_Mutex;
  std::mutex::lock((mutex *)&local_190->__data);
  localDeviceList = (cl_device_id *)0x0;
  if (deviceList == (cl_device_id *)0x0) {
    cVar4 = allocateAndGetProgramDeviceList(this,program,&numDevices_local,&localDeviceList);
    deviceList = (cl_device_id *)0x0;
    bVar10 = cVar4 == 0;
    if (bVar10) {
      deviceList = localDeviceList;
    }
  }
  else {
    bVar10 = true;
  }
  local_198 = localDeviceList;
  if ((bVar10) && ((this->m_Config).BuildLogging != false)) {
    pmVar7 = std::
             map<_cl_program_*,_CLIntercept::SProgramInfo,_std::less<_cl_program_*>,_std::allocator<std::pair<_cl_program_*const,_CLIntercept::SProgramInfo>_>_>
             ::operator[](&this->m_ProgramInfoMap,&program_local);
    memset(numberString,0,0x100);
    if ((this->m_Config).OmitProgramNumber == true) {
      uVar1 = pmVar7->CompileCount;
      uVar2 = (uint)pmVar7->ProgramHash;
      pcVar8 = "$%08X_%04u_%08X";
    }
    else {
      uVar1 = (uint)pmVar7->ProgramHash;
      uVar2 = pmVar7->ProgramNumber;
      pcVar8 = "$%04u_%08X_%04u_%08X";
    }
    snprintf(numberString,0x100,pcVar8 + 1,(ulong)uVar2,(ulong)uVar1);
    logf(this,__x);
    logf(this,SUB84((double)((float)(lVar6 - (long)buildTimeStart.__d.__r) / 1e+06),0));
  }
  if (bVar10) {
    local_160 = &this->m_EnumNameMap;
    for (uVar9 = 0; uVar9 < numDevices_local; uVar9 = uVar9 + 1) {
      if ((this->m_Config).BuildLogging == true) {
        buildStatus = -1;
        cVar4 = (*(this->m_Dispatch).clGetProgramBuildInfo)
                          (program_local,deviceList[uVar9],0x1181,4,&buildStatus,(size_t *)0x0);
        if (cVar4 == 0) {
          local_1a0 = (char *)0x0;
          local_1a8 = (char *)0x0;
          cVar4 = allocateAndGetDeviceInfoString(this,deviceList[uVar9],0x102b,&local_1a0);
          cVar5 = allocateAndGetDeviceInfoString(this,deviceList[uVar9],0x103d,&local_1a8);
          memset((string *)numberString,0,0x100);
          snprintf(numberString,0x100,"Build Status for device %u = ");
          std::__cxx11::string::string((string *)&buildLogSize,numberString,(allocator *)&local_158)
          ;
          if (cVar5 == 0 && cVar4 == 0) {
            std::__cxx11::string::append((char *)&buildLogSize);
            std::__cxx11::string::append((char *)&buildLogSize);
            std::__cxx11::string::append((char *)&buildLogSize);
            std::__cxx11::string::append((char *)&buildLogSize);
          }
          CEnumNameMap::name_build_status_abi_cxx11_(&local_158,local_160,buildStatus);
          std::__cxx11::string::append((string *)&buildLogSize);
          std::__cxx11::string::~string((string *)&local_158);
          dVar11 = (double)std::__cxx11::string::append((char *)&buildLogSize);
          log(this,dVar11);
          if (local_1a0 != (char *)0x0) {
            operator_delete__(local_1a0);
          }
          if (local_1a8 != (char *)0x0) {
            operator_delete__(local_1a8);
          }
          std::__cxx11::string::~string((string *)&buildLogSize);
        }
      }
      buildLogSize = 0;
      cVar4 = (*(this->m_Dispatch).clGetProgramBuildInfo)
                        (program_local,deviceList[uVar9],0x1183,0,(void *)0x0,&buildLogSize);
      sVar3 = buildLogSize;
      if (cVar4 == 0) {
        pcVar8 = (char *)operator_new__(buildLogSize + 1);
        (*(this->m_Dispatch).clGetProgramBuildInfo)
                  (program_local,deviceList[uVar9],0x1183,sVar3,pcVar8,(size_t *)0x0);
        if (pcVar8[buildLogSize - 1] == '\0') {
          buildLogSize = buildLogSize - 1;
        }
        else {
          pcVar8[buildLogSize] = '\0';
        }
        if ((this->m_Config).BuildLogging == true) {
          dVar11 = (double)std::__cxx11::string::string
                                     ((string *)numberString,"-------> Start of Build Log:\n",
                                      (allocator *)&local_158);
          log(this,dVar11);
          std::__cxx11::string::~string((string *)numberString);
          dVar11 = (double)std::__cxx11::string::string
                                     ((string *)numberString,pcVar8,(allocator *)&local_158);
          log(this,dVar11);
          std::__cxx11::string::~string((string *)numberString);
          dVar11 = (double)std::__cxx11::string::string
                                     ((string *)numberString,"<------- End of Build Log\n\n",
                                      (allocator *)&local_158);
          log(this,dVar11);
          std::__cxx11::string::~string((string *)numberString);
        }
        if ((this->m_Config).DumpProgramBuildLogs == true) {
          dumpProgramBuildLog(this,program_local,deviceList[uVar9],pcVar8,buildLogSize);
        }
        operator_delete__(pcVar8);
      }
    }
  }
  if (local_198 != (cl_device_id *)0x0) {
    operator_delete__(local_198);
  }
  pthread_mutex_unlock(local_190);
  return;
}

Assistant:

void CLIntercept::logBuild(
    clock::time_point buildTimeStart,
    const cl_program program,
    cl_uint numDevices,
    const cl_device_id* deviceList )
{
    std::chrono::duration<float, std::milli>    buildDuration =
        clock::now() - buildTimeStart;

    std::lock_guard<std::mutex> lock(m_Mutex);

    cl_device_id*   localDeviceList = NULL;

    cl_int  errorCode = CL_SUCCESS;

    // There are two possibilities.  Either the device_list is NULL, in which
    // case we need to get the build log for all devices, or it's non-NULL,
    // in which case we only need to get the build log for all devices in
    // the device list.

    if( ( errorCode == CL_SUCCESS ) &&
        ( deviceList == NULL ) )
    {
        errorCode = allocateAndGetProgramDeviceList(
            program,
            numDevices,
            localDeviceList );
        if( errorCode == CL_SUCCESS )
        {
            deviceList = localDeviceList;
        }
    }

    if( m_Config.BuildLogging &&
        errorCode == CL_SUCCESS )
    {
        const SProgramInfo& programInfo = m_ProgramInfoMap[ program ];

        char    numberString[256] = "";
        if( config().OmitProgramNumber )
        {
            CLI_SPRINTF( numberString, 256, "%08X_%04u_%08X",
                (unsigned int)programInfo.ProgramHash,
                programInfo.CompileCount,
                (unsigned int)programInfo.OptionsHash );
        }
        else
        {
            CLI_SPRINTF( numberString, 256, "%04u_%08X_%04u_%08X",
                programInfo.ProgramNumber,
                (unsigned int)programInfo.ProgramHash,
                programInfo.CompileCount,
                (unsigned int)programInfo.OptionsHash );
        }

        logf( "Build Info for program %p (%s) for %u device(s):\n",
            program,
            numberString,
            numDevices );

        float   buildTimeMS = buildDuration.count();
        logf( "    Build finished in %.2f ms.\n", buildTimeMS );
    }

    if( errorCode == CL_SUCCESS )
    {
        for( cl_uint i = 0; i < numDevices; i++ )
        {
            if( m_Config.BuildLogging )
            {
                cl_build_status buildStatus = CL_BUILD_NONE;
                errorCode = dispatch().clGetProgramBuildInfo(
                    program,
                    deviceList[ i ],
                    CL_PROGRAM_BUILD_STATUS,
                    sizeof( buildStatus ),
                    &buildStatus,
                    NULL );

                if( errorCode == CL_SUCCESS )
                {
                    char*   deviceName = NULL;
                    char*   deviceOpenCLCVersion = NULL;
                    errorCode = allocateAndGetDeviceInfoString(
                        deviceList[i],
                        CL_DEVICE_NAME,
                        deviceName );
                    errorCode |= allocateAndGetDeviceInfoString(
                        deviceList[i],
                        CL_DEVICE_OPENCL_C_VERSION,
                        deviceOpenCLCVersion );

                    char    str[256] = "";

                    CLI_SPRINTF( str, 256, "Build Status for device %u = ", i );

                    std::string message = str;

                    if( errorCode == CL_SUCCESS )
                    {
                        message += deviceName;
                        message += " (";
                        message += deviceOpenCLCVersion;
                        message += "): ";
                    }

                    message += enumName().name_build_status( buildStatus );
                    message += "\n";

                    log( message );

                    delete [] deviceName;
                    deviceName = NULL;

                    delete [] deviceOpenCLCVersion;
                    deviceOpenCLCVersion = NULL;
                }
            }

            size_t  buildLogSize = 0;
            errorCode = dispatch().clGetProgramBuildInfo(
                program,
                deviceList[ i ],
                CL_PROGRAM_BUILD_LOG,
                0,
                NULL,
                &buildLogSize );

            if( errorCode == CL_SUCCESS )
            {
                char*   buildLog = new char[ buildLogSize + 1 ];
                if( buildLog )
                {
                    dispatch().clGetProgramBuildInfo(
                        program,
                        deviceList[ i ],
                        CL_PROGRAM_BUILD_LOG,
                        buildLogSize,
                        buildLog,
                        NULL );

                    // Check if the build log is already null-terminated.
                    // If it is, we're good, otherwise null terminate it.
                    if( buildLog[ buildLogSize - 1 ] == '\0' )
                    {
                        buildLogSize--;
                    }
                    else
                    {
                        buildLog[ buildLogSize ] = '\0';
                    }

                    if( m_Config.BuildLogging )
                    {
                        log( "-------> Start of Build Log:\n" );
                        log( std::string(buildLog) );
                        log( "<------- End of Build Log\n\n" );
                    }
                    if( m_Config.DumpProgramBuildLogs )
                    {
                        dumpProgramBuildLog(
                            program,
                            deviceList[ i ],
                            buildLog,
                            buildLogSize );
                    }

                    delete [] buildLog;
                }
            }
        }
    }

    delete [] localDeviceList;
}